

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::Shape
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar1;
  long lVar2;
  long lVar3;
  int local_c4;
  TPZManVector<long,_4> id;
  TPZManVector<int,_12> ord;
  
  ord.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<long,_4>::TPZManVector(&id,4,(long *)&ord);
  local_c4 = 0;
  TPZManVector<int,_12>::TPZManVector(&ord,0xb,&local_c4);
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    pTVar1 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    id.super_TPZVec<long>.fStore[lVar3] = (long)pTVar1->fId;
  }
  for (lVar3 = 0; lVar3 != 0xb; lVar3 = lVar3 + 1) {
    lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,(int)lVar3 + 4);
    ord.super_TPZVec<int>.fStore[lVar3] = (uint)*(byte *)(lVar2 + 0x14);
  }
  pzshape::TPZShapeTetra::Shape(pt,&id.super_TPZVec<long>,&ord.super_TPZVec<int>,phi,dphi);
  TPZManVector<int,_12>::~TPZManVector(&ord);
  TPZManVector<long,_4>::~TPZManVector(&id);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}